

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<void_(*)(const_QDBusMessage_&)>::relocate
          (QArrayDataPointer<void_(*)(const_QDBusMessage_&)> *this,qsizetype offset,
          _func_void_QDBusMessage_ptr ***data)

{
  _func_void_QDBusMessage_ptr **d_first;
  _func_void_QDBusMessage_ptr **pp_Var1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<void(*)(QDBusMessage_const&),long_long>
            (this->ptr,this->size,d_first);
  if (data != (_func_void_QDBusMessage_ptr ***)0x0) {
    pp_Var1 = *data;
    if ((this->ptr <= pp_Var1) && (pp_Var1 < this->ptr + this->size)) {
      *data = pp_Var1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }